

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int same_symbol(symbol *a,symbol *b)

{
  uint uVar1;
  ulong uVar2;
  
  if (a != b) {
    if (a->type != MULTITERMINAL) {
      return 0;
    }
    if (b->type != MULTITERMINAL) {
      return 0;
    }
    uVar1 = a->nsubsym;
    if (uVar1 != b->nsubsym) {
      return 0;
    }
    if (0 < (int)uVar1) {
      uVar2 = 0;
      do {
        if (a->subsym[uVar2] != b->subsym[uVar2]) {
          return 0;
        }
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
  }
  return 1;
}

Assistant:

int same_symbol(struct symbol *a, struct symbol *b)
{
  int i;
  if( a==b ) return 1;
  if( a->type!=MULTITERMINAL ) return 0;
  if( b->type!=MULTITERMINAL ) return 0;
  if( a->nsubsym!=b->nsubsym ) return 0;
  for(i=0; i<a->nsubsym; i++){
    if( a->subsym[i]!=b->subsym[i] ) return 0;
  }
  return 1;
}